

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polymer.cpp
# Opt level: O3

bool __thiscall Polymer::CheckTermination(Polymer *this,int pol_index)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  MobileElementManager *this_00;
  int iVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  long lVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  pointer ppVar7;
  _Alloc_hider this_01;
  bool bVar8;
  int iVar9;
  mapped_type *pmVar10;
  SpeciesTracker *this_02;
  undefined8 uVar11;
  int iVar12;
  double extraout_XMM0_Qa;
  Ptr transcript;
  Ptr pol;
  vector<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
  results;
  undefined1 local_e0 [16];
  long local_d0 [2];
  int local_bc;
  shared_ptr<PolymerWrapper> local_b8;
  shared_ptr<PolymerWrapper> local_a8;
  pointer local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  shared_ptr<PolymerWrapper> local_80;
  pointer local_70;
  pointer local_68;
  Signal<std::shared_ptr<PolymerWrapper>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  *local_60;
  _Alloc_hider local_58;
  double local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  pointer local_38;
  
  this_00 = &this->polymerases_;
  MobileElementManager::GetPol((MobileElementManager *)&local_98,(int)this_00);
  ppVar7 = local_98;
  iVar9 = *(int *)((long)&local_98[1].second.super___shared_ptr<Polymer,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount._M_pi + 4);
  if (iVar9 < this->stop_) {
    local_48._M_allocated_capacity = 0;
    local_48._8_8_ = 0;
    local_38 = (pointer)0x0;
    local_90._8_8_ = this;
    IntervalTree<std::shared_ptr<ReleaseSite>,_unsigned_long>::findOverlapping
              (&this->release_sites_,
               (long)*(int *)&local_98[1].second.
                              super___shared_ptr<Polymer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                              _M_pi,(long)iVar9,(intervalVector *)&local_48);
    uVar6 = local_48._8_8_;
    if (local_48._M_allocated_capacity != local_48._8_8_) {
      local_60 = (Signal<std::shared_ptr<PolymerWrapper>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                  *)(local_90._8_8_ + 0x18);
      p_Var1 = &(ppVar7->second).super___shared_ptr<Polymer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ;
      uVar11 = local_48._M_allocated_capacity;
      local_bc = pol_index;
      local_58._M_p = (pointer)this_00;
LAB_0011907b:
      bVar8 = ReleaseSite::CheckInteraction
                        (*(ReleaseSite **)(uVar11 + 0x10),(string *)p_Var1,
                         *(int *)&ppVar7[2].second.
                                  super___shared_ptr<Polymer,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      if ((!bVar8) || (*(char *)(*(long *)(uVar11 + 0x10) + 0x9d) != '\0')) goto LAB_00119164;
      local_e0._0_8_ = local_d0;
      p_Var3 = ppVar7[2].second.super___shared_ptr<Polymer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_e0,p_Var3,
                 (long)&p_Var3->_vptr__Sp_counted_base +
                 (long)ppVar7[3].first.super___shared_ptr<MobileElement,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr);
      uVar5 = local_e0._0_8_;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e0._8_8_ ==
          *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(*(long *)(uVar11 + 0x10) + 0x78)) {
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e0._8_8_ ==
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          bVar8 = true;
        }
        else {
          iVar9 = bcmp((void *)local_e0._0_8_,*(void **)(*(long *)(uVar11 + 0x10) + 0x70),
                       local_e0._8_8_);
          bVar8 = iVar9 == 0;
        }
      }
      else {
        bVar8 = false;
      }
      if ((long *)uVar5 != local_d0) {
        operator_delete((void *)uVar5);
      }
      if (!bVar8) goto LAB_00119164;
      Random::random();
      local_50 = extraout_XMM0_Qa;
      pmVar10 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                              *)(*(long *)(uVar11 + 0x10) + 0x40),(key_type *)p_Var1);
      this_01._M_p = local_58._M_p;
      iVar9 = local_bc;
      lVar4 = *(long *)(uVar11 + 0x10);
      if (*pmVar10 < local_50) {
        iVar9 = *(int *)(lVar4 + 0x90) + 1;
        *(int *)(lVar4 + 0x90) = iVar9;
        *(int *)(lVar4 + 0x94) = iVar9;
        *(undefined1 *)(lVar4 + 0x9d) = 1;
        goto LAB_00119164;
      }
      iVar12 = *(int *)(lVar4 + 0x3c);
      iVar2 = *(int *)((long)&ppVar7[1].second.
                              super___shared_ptr<Polymer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                              _M_pi + 4);
      MobileElementManager::GetAttached((MobileElementManager *)local_e0,(int)local_58._M_p);
      uVar6 = local_e0._0_8_;
      if ((long *)local_e0._0_8_ != (long *)0x0) {
        if (iVar2 <= iVar12) {
          iVar12 = (iVar12 - iVar2) + 1;
          do {
            (**(code **)(*(long *)uVar6 + 0x10))(uVar6);
            iVar12 = iVar12 + -1;
          } while (iVar12 != 0);
        }
        *(char *)(uVar6 + 0x111) = '\0';
      }
      local_80.super___shared_ptr<PolymerWrapper,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)(local_90._8_8_ + 0x58))->_M_pi;
      if (local_80.super___shared_ptr<PolymerWrapper,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
LAB_00119489:
        local_80.super___shared_ptr<PolymerWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
      }
      else {
        iVar12 = (local_80.super___shared_ptr<PolymerWrapper,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count;
        do {
          if (iVar12 == 0) {
            local_80.super___shared_ptr<PolymerWrapper,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            goto LAB_00119489;
          }
          LOCK();
          iVar2 = (local_80.super___shared_ptr<PolymerWrapper,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_use_count;
          bVar8 = iVar12 == iVar2;
          if (bVar8) {
            (local_80.super___shared_ptr<PolymerWrapper,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi)->_M_use_count = iVar12 + 1;
            iVar2 = iVar12;
          }
          iVar12 = iVar2;
          UNLOCK();
        } while (!bVar8);
        if ((local_80.super___shared_ptr<PolymerWrapper,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) ||
           ((local_80.super___shared_ptr<PolymerWrapper,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi)->_M_use_count == 0)) goto LAB_00119489;
        local_80.super___shared_ptr<PolymerWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (((weak_ptr<PolymerWrapper> *)(local_90._8_8_ + 0x50))->
             super___weak_ptr<PolymerWrapper,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      }
      Signal<std::shared_ptr<PolymerWrapper>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
      ::Emit(local_60,&local_80,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &(local_98->second).super___shared_ptr<Polymer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
             ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              (*(long *)(uVar11 + 0x10) + 0x70));
      if (local_80.super___shared_ptr<PolymerWrapper,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_80.super___shared_ptr<PolymerWrapper,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      MobileElementManager::Delete((MobileElementManager *)this_01._M_p,iVar9);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e0._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e0._8_8_);
      }
      bVar8 = true;
      goto LAB_00119173;
    }
LAB_00119171:
    bVar8 = false;
LAB_00119173:
    std::
    vector<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
    ::~vector((vector<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<ReleaseSite>,_unsigned_long>_>_>
               *)&local_48);
    goto LAB_001193d6;
  }
  iVar9 = std::__cxx11::string::compare
                    ((char *)&(local_98->second).
                              super___shared_ptr<Polymer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  if (iVar9 == 0) {
    MobileElementManager::Delete(this_00,pol_index);
    this->degrade_ = true;
    bVar8 = true;
    goto LAB_001193d6;
  }
  p_Var3 = (this->wrapper_).super___weak_ptr<PolymerWrapper,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi;
  if (*(char *)&ppVar7[3].second.super___shared_ptr<Polymer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                ._M_pi != '\x01') {
    local_b8.super___shared_ptr<PolymerWrapper,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         p_Var3;
    if (p_Var3 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
LAB_00119307:
      local_b8.super___shared_ptr<PolymerWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
    }
    else {
      iVar9 = p_Var3->_M_use_count;
      do {
        if (iVar9 == 0) {
          local_b8.super___shared_ptr<PolymerWrapper,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
               = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          goto LAB_00119307;
        }
        LOCK();
        iVar12 = p_Var3->_M_use_count;
        bVar8 = iVar9 == iVar12;
        if (bVar8) {
          p_Var3->_M_use_count = iVar9 + 1;
          iVar12 = iVar9;
        }
        iVar9 = iVar12;
        UNLOCK();
      } while (!bVar8);
      if ((p_Var3 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) ||
         (p_Var3->_M_use_count == 0)) goto LAB_00119307;
      local_b8.super___shared_ptr<PolymerWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (this->wrapper_).super___weak_ptr<PolymerWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    }
    local_e0._0_8_ = local_d0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_e0,"NA","");
    Signal<std::shared_ptr<PolymerWrapper>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::Emit(&this->termination_signal_,&local_b8,
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &(local_98->second).super___shared_ptr<Polymer,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0);
    if ((long *)local_e0._0_8_ != local_d0) {
      operator_delete((void *)local_e0._0_8_);
    }
    if (local_b8.super___shared_ptr<PolymerWrapper,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_b8.super___shared_ptr<PolymerWrapper,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                 ._M_pi);
    }
    bVar8 = true;
    MobileElementManager::Delete(this_00,pol_index);
    goto LAB_001193d6;
  }
  local_a8.super___shared_ptr<PolymerWrapper,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var3
  ;
  if (p_Var3 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
LAB_00119246:
    local_a8.super___shared_ptr<PolymerWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
  }
  else {
    iVar9 = p_Var3->_M_use_count;
    do {
      if (iVar9 == 0) {
        local_a8.super___shared_ptr<PolymerWrapper,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        goto LAB_00119246;
      }
      LOCK();
      iVar12 = p_Var3->_M_use_count;
      bVar8 = iVar9 == iVar12;
      if (bVar8) {
        p_Var3->_M_use_count = iVar9 + 1;
        iVar12 = iVar9;
      }
      iVar9 = iVar12;
      UNLOCK();
    } while (!bVar8);
    if ((p_Var3 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) ||
       (p_Var3->_M_use_count == 0)) goto LAB_00119246;
    local_a8.super___shared_ptr<PolymerWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (this->wrapper_).super___weak_ptr<PolymerWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  local_e0._0_8_ = local_d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e0,"NA","");
  p_Var1 = &(local_98->second).super___shared_ptr<Polymer,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  Signal<std::shared_ptr<PolymerWrapper>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::Emit(&this->termination_signal_,&local_a8,
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)p_Var1,
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0);
  if ((long *)local_e0._0_8_ != local_d0) {
    operator_delete((void *)local_e0._0_8_);
  }
  if (local_a8.super___shared_ptr<PolymerWrapper,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_a8.super___shared_ptr<PolymerWrapper,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  MobileElementManager::Delete(this_00,pol_index);
  this_02 = SpeciesTracker::Instance();
  SpeciesTracker::Increment(this_02,(string *)p_Var1,-1);
  local_70 = local_98;
  local_68 = (pointer)local_90._M_allocated_capacity;
  if ((pointer)local_90._M_allocated_capacity != (pointer)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_90._M_allocated_capacity + 8))
               ->_M_pi =
           *(int *)&((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                    (local_90._M_allocated_capacity + 8))->_M_pi + 1;
      UNLOCK();
    }
    else {
      *(int *)&((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_90._M_allocated_capacity + 8))
               ->_M_pi =
           *(int *)&((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                    (local_90._M_allocated_capacity + 8))->_M_pi + 1;
    }
  }
  local_e0._0_8_ = local_d0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e0,"readthrough","");
  (*this->_vptr_Polymer[1])(this,&local_70,local_e0);
  if ((long *)local_e0._0_8_ != local_d0) {
    operator_delete((void *)local_e0._0_8_);
  }
  bVar8 = true;
  if (local_68 != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68);
  }
LAB_001193d6:
  if ((pointer)local_90._M_allocated_capacity != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90._M_allocated_capacity);
  }
  return bVar8;
LAB_00119164:
  uVar11 = uVar11 + 0x20;
  if (uVar11 == uVar6) goto LAB_00119171;
  goto LAB_0011907b;
}

Assistant:

bool Polymer::CheckTermination(int pol_index) {
  auto pol = polymerases_.GetPol(pol_index);
  if (pol->stop() >= stop_) {
    if (pol->name() == "__rnase") {
      // std::cout << "rnase ran off end of transcript" << std::endl;
      polymerases_.Delete(pol_index);
      degrade_ = true;
      return true;
    } else if (pol->polymerasereadthrough()) {
      // Create a new transcript and unbind/rebind pol so that
      // all necessary checks still occur
      termination_signal_.Emit(wrapper(), pol->name(), "NA");
      polymerases_.Delete(pol_index);
      // The termination signal increments the pol count by 1,
      // so decrement it here since the polymerase was actually
      // just moved to the beginning of the genome
      SpeciesTracker::Instance().Increment(pol->name(), -1);
      Bind(pol, "readthrough"); 
      return true;
    } else {
      termination_signal_.Emit(wrapper(), pol->name(), "NA");
      polymerases_.Delete(pol_index);
      return true;
    }
  }
  std::vector<Interval<ReleaseSite::Ptr>> results;
  release_sites_.findOverlapping(pol->start(), pol->stop(), results);
  for (auto &interval : results) {
    if (interval.value->CheckInteraction(pol->name(), pol->reading_frame()) &&
        !interval.value->readthrough() &&
        pol->gene_bound() == interval.value->gene()) {
      // terminate
      // std::cout << pol->name() + " " + interval.value->name() << std::endl;
      double random_num = Random::random();
      if (random_num <= interval.value->efficiency(pol->name())) {
        // std::cout << pol->name() + " terminating" << std::endl;
        // Fire Emit signal until entire terminator is uncovered
        // Coordinates are inclusive, so must add 1 after calculating
        // difference
        int dist = interval.value->stop() - pol->stop() + 1;
        auto transcript = polymerases_.GetAttached(pol_index);
        if (transcript != nullptr) {
          for (int i = 0; i < dist; i++) {
            transcript->ShiftMask();
          }
          transcript->attached(false);
        }
        termination_signal_.Emit(wrapper(), pol->name(),
                                 interval.value->gene());
        polymerases_.Delete(pol_index);
        return true;
      } else {
        interval.value->Cover();
        interval.value->ResetState();
        // std::cout << "Readthrough set to true!" << std::endl;
        interval.value->readthrough(true);
      }
    }
  }
  return false;
}